

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

Expression *
slang::ast::MemberAccessExpression::fromSelector
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context,bool isFromLookupChain)

{
  uint uVar1;
  SymbolKind SVar2;
  size_t sVar3;
  SourceRange range_00;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  bool bVar4;
  Expression *pEVar5;
  ClassType *this;
  Scope *this_00;
  FieldSymbol *args_2;
  Type *pTVar6;
  CovergroupBodySymbol *pCVar7;
  Diagnostic *pDVar8;
  MemberAccessExpression *pMVar9;
  ValueSymbol *value;
  ClassType *ct;
  string_view methodName;
  SourceRange sourceRange_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  SourceRange sourceRange_02;
  undefined1 in_stack_ffffffffffffff10;
  ASTContext *in_stack_ffffffffffffff18;
  ASTContext *context_00;
  SourceRange range;
  anon_class_16_2_15dbab97 errorIfNotProcedural;
  anon_class_16_2_15dbab97 errorIfAssertion;
  undefined7 uStack_97;
  undefined7 uStack_77;
  FieldSymbol *local_68;
  undefined1 local_38;
  
  sVar3 = (selector->name)._M_len;
  if (sVar3 == 0) {
    pEVar5 = Expression::badExpr(compilation,expr);
    return pEVar5;
  }
  range.startLoc = (expr->sourceRange).startLoc;
  range.endLoc = (selector->nameRange).endLoc;
  if (expr->kind == Call) {
    if (isFromLookupChain) {
      sourceRange_02.endLoc = range.endLoc;
      sourceRange_02.startLoc = range.startLoc;
      ASTContext::addDiag(context,(DiagCode)0x390007,sourceRange_02);
    }
  }
  else if (((expr->kind == NamedValue) && (**(int **)(expr + 1) == 0x46)) &&
          (__y._M_str = (selector->name)._M_str, __y._M_len = sVar3,
          bVar4 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                   (*(int **)(expr + 1) + 0x5a),__y), bVar4)) {
    in_stack_ffffffffffffff10 = SUB81(context,0);
    methodName._M_str = (char *)invocation;
    methodName._M_len = (size_t)"index";
    pEVar5 = CallExpression::fromBuiltInMethod
                       ((CallExpression *)compilation,(Compilation *)0x46,(SymbolKind)expr,
                        (Expression *)0x5,methodName,(InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,in_stack_ffffffffffffff18)
    ;
    if (pEVar5 != (Expression *)0x0) {
      return pEVar5;
    }
  }
  errorIfNotProcedural.range = &range;
  errorIfNotProcedural.context = context;
  errorIfAssertion.context = context;
  errorIfAssertion.range = errorIfNotProcedural.range;
  this = (ClassType *)Type::getCanonicalType((expr->type).ptr);
  switch((this->super_Type).super_Symbol.kind) {
  case EnumType:
  case FixedSizeUnpackedArrayType:
  case DynamicArrayType:
  case AssociativeArrayType:
  case QueueType:
  case StringType:
  case EventType:
  case SequenceType:
    pEVar5 = tryBindSpecialMethod(compilation,expr,selector,invocation,withClause,context);
    if (pEVar5 != (Expression *)0x0) {
      return pEVar5;
    }
    pEVar5 = CallExpression::fromSystemMethod
                       (compilation,expr,selector,invocation,withClause,context);
    return pEVar5;
  case PackedStructType:
  case UnpackedStructType:
  case PackedUnionType:
  case UnpackedUnionType:
    this_00 = Symbol::scopeOrNull((Symbol *)this);
    goto LAB_0063e49d;
  case ClassType:
    pTVar6 = ClassType::getBaseClass(this);
    if ((pTVar6 == (Type *)0x0) || (bVar4 = Type::isError(pTVar6), !bVar4)) {
      this_00 = &this->super_Scope;
      goto LAB_0063e49d;
    }
    break;
  case CovergroupType:
    pCVar7 = CovergroupType::getBody((CovergroupType *)this);
LAB_0063e499:
    this_00 = &pCVar7->super_Scope;
LAB_0063e49d:
    args_2 = (FieldSymbol *)Scope::find(this_00,selector->name);
    if (args_2 != (FieldSymbol *)0x0) {
      SVar2 = (args_2->super_VariableSymbol).super_ValueSymbol.super_Symbol.kind;
      uVar1 = SVar2 - ClassProperty;
      if (uVar1 < 0x20) {
        if ((0xb0000200U >> (uVar1 & 0x1f) & 1) != 0) {
          bVar4 = fromSelector::anon_class_16_2_15dbab97::operator()(&errorIfNotProcedural);
          if (!bVar4) {
            pMVar9 = BumpAllocator::
                     emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Symbol_const&,slang::SourceRange&>
                               (&compilation->super_BumpAllocator,compilation->voidType,expr,
                                (Symbol *)args_2,&range);
            return &pMVar9->super_Expression;
          }
          goto LAB_0063e6bb;
        }
        if (uVar1 == 0) {
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_77;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._9_7_ =
               SUB87((selector->nameRange).endLoc,1);
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._0_9_ =
               *(unkbyte9 *)&selector->nameRange;
          Lookup::ensureVisible((Symbol *)args_2,context,sourceRange_00);
          if (((args_2->super_VariableSymbol).lifetime != Automatic) ||
             ((bVar4 = fromSelector::anon_class_16_2_15dbab97::operator()(&errorIfNotProcedural),
              !bVar4 && (bVar4 = fromSelector::anon_class_16_2_15dbab97::operator()
                                           (&errorIfAssertion), !bVar4)))) {
            pTVar6 = DeclaredType::getType
                               (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
            pMVar9 = BumpAllocator::
                     emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ClassPropertySymbol_const&,slang::SourceRange&>
                               (&compilation->super_BumpAllocator,pTVar6,expr,
                                (ClassPropertySymbol *)args_2,&range);
            return &pMVar9->super_Expression;
          }
          goto LAB_0063e6bb;
        }
        if (uVar1 == 1) {
          context_00 = (ASTContext *)CONCAT71(uStack_97,1);
          sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._9_7_ =
               SUB87((selector->nameRange).endLoc,1);
          sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._0_9_ =
               *(unkbyte9 *)&selector->nameRange;
          sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._16_8_ = context_00;
          Lookup::ensureVisible((Symbol *)args_2,context,sourceRange);
          if (((*(byte *)((long)&(args_2->super_VariableSymbol).super_ValueSymbol.driverMap.field_0
                         + 0x44) & 4) != 0) ||
             ((bVar4 = fromSelector::anon_class_16_2_15dbab97::operator()(&errorIfNotProcedural),
              !bVar4 && (bVar4 = fromSelector::anon_class_16_2_15dbab97::operator()
                                           (&errorIfAssertion), !bVar4)))) {
            local_38 = 0;
            range_00.endLoc._0_1_ = range.endLoc._0_1_;
            range_00.startLoc = range.startLoc;
            range_00.endLoc._1_7_ = range.endLoc._1_7_;
            local_68 = args_2;
            pEVar5 = CallExpression::fromLookup
                               ((CallExpression *)compilation,
                                (Compilation *)&stack0xffffffffffffff98,(Subroutine *)expr,
                                (Expression *)invocation,(InvocationExpressionSyntax *)withClause,
                                (ArrayOrRandomizeMethodExpressionSyntax *)context,range_00,
                                context_00);
            return pEVar5;
          }
          goto LAB_0063e6bb;
        }
      }
      if (SVar2 == EnumValue) {
        sourceRange_01.endLoc = (SourceLocation)0x0;
        sourceRange_01.startLoc = range.endLoc;
        pEVar5 = ValueExpressionBase::fromSymbol
                           ((ValueExpressionBase *)context,(ASTContext *)args_2,(Symbol *)0x0,
                            (HierarchicalReference *)range.startLoc,sourceRange_01,false,
                            (bool)in_stack_ffffffffffffff10);
        return pEVar5;
      }
      if (SVar2 == Field) {
        pTVar6 = DeclaredType::getType
                           (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
        pMVar9 = BumpAllocator::
                 emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::FieldSymbol_const&,slang::SourceRange&>
                           (&compilation->super_BumpAllocator,pTVar6,expr,args_2,&range);
        return &pMVar9->super_Expression;
      }
      bVar4 = Symbol::isValue((Symbol *)args_2);
      if (bVar4) {
        pTVar6 = DeclaredType::getType
                           (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
        pMVar9 = BumpAllocator::
                 emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                           (&compilation->super_BumpAllocator,pTVar6,expr,(ValueSymbol *)args_2,
                            &range);
        return &pMVar9->super_Expression;
      }
      pDVar8 = ASTContext::addDiag(context,(DiagCode)0x630007,selector->dotLocation);
      Diagnostic::operator<<(pDVar8,selector->nameRange);
      Diagnostic::operator<<(pDVar8,expr->sourceRange);
      Diagnostic::operator<<(pDVar8,selector->name);
      ast::operator<<(pDVar8,(expr->type).ptr);
      goto LAB_0063e6bb;
    }
    pEVar5 = tryBindSpecialMethod(compilation,expr,selector,invocation,withClause,context);
    if (pEVar5 != (Expression *)0x0) {
      return pEVar5;
    }
    pDVar8 = ASTContext::addDiag(context,(DiagCode)0x3a000a,(selector->nameRange).startLoc);
    Diagnostic::operator<<(pDVar8,expr->sourceRange);
    Diagnostic::operator<<(pDVar8,selector->name);
    goto LAB_0063e6ac;
  case VoidType:
    pCVar7 = (CovergroupBodySymbol *)Expression::getSymbolReference(expr,true);
    if ((pCVar7 != (CovergroupBodySymbol *)0x0) &&
       ((SVar2 = (pCVar7->super_Symbol).kind, SVar2 == CoverCross || (SVar2 == Coverpoint))))
    goto LAB_0063e499;
  default:
    pEVar5 = tryBindSpecialMethod(compilation,expr,selector,invocation,withClause,context);
    if (pEVar5 != (Expression *)0x0) {
      return pEVar5;
    }
    pDVar8 = ASTContext::addDiag(context,(DiagCode)0x650007,selector->dotLocation);
    Diagnostic::operator<<(pDVar8,expr->sourceRange);
    Diagnostic::operator<<(pDVar8,selector->nameRange);
LAB_0063e6ac:
    ast::operator<<(pDVar8,(expr->type).ptr);
    break;
  case ErrorType:
    break;
  }
LAB_0063e6bb:
  pEVar5 = Expression::badExpr(compilation,expr);
  return pEVar5;
}

Assistant:

Expression& MemberAccessExpression::fromSelector(
    Compilation& compilation, Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* invocation,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context,
    bool isFromLookupChain) {

    // If the selector name is invalid just give up early.
    if (selector.name.empty())
        return badExpr(compilation, &expr);

    // The source range of the entire member access starts from the value being selected.
    SourceRange range{expr.sourceRange.start(), selector.nameRange.end()};

    // Special cases for built-in iterator methods that don't cleanly fit the general
    // mold of looking up members via the type of the expression.
    if (expr.kind == ExpressionKind::NamedValue) {
        auto& sym = expr.as<NamedValueExpression>().symbol;
        auto symKind = sym.kind;
        if (symKind == SymbolKind::Iterator) {
            auto& iter = sym.as<IteratorSymbol>();
            if (iter.indexMethodName == selector.name) {
                auto result = CallExpression::fromBuiltInMethod(compilation, symKind, expr,
                                                                "index"sv, invocation, withClause,
                                                                context);
                if (result)
                    return *result;
            }
        }
    }
    else if (expr.kind == ExpressionKind::Call && isFromLookupChain) {
        // It's an error to dot select from a call expression that
        // doesn't include parentheses, which it doesn't iff
        // isFromLookupChain is set.
        context.addDiag(diag::ChainedMethodParens, range);
    }

    auto errorIfNotProcedural = [&] {
        if (context.flags.has(ASTFlags::NonProcedural)) {
            context.addDiag(diag::DynamicNotProcedural, range);
            return true;
        }
        return false;
    };
    auto errorIfAssertion = [&] {
        if (context.flags.has(ASTFlags::AssertionExpr)) {
            context.addDiag(diag::ClassMemberInAssertion, range);
            return true;
        }
        return false;
    };

    // This might look like a member access but actually be a built-in type method.
    const Type& type = expr.type->getCanonicalType();
    const Scope* scope = nullptr;
    switch (type.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
        case SymbolKind::PackedUnionType:
        case SymbolKind::UnpackedUnionType:
            scope = &type.as<Scope>();
            break;
        case SymbolKind::ClassType: {
            auto& ct = type.as<ClassType>();
            if (auto base = ct.getBaseClass(); base && base->isError())
                return badExpr(compilation, &expr);

            scope = &ct;
            break;
        }
        case SymbolKind::CovergroupType:
            scope = &type.as<CovergroupType>().getBody();
            break;
        case SymbolKind::EnumType:
        case SymbolKind::StringType:
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
        case SymbolKind::EventType:
        case SymbolKind::SequenceType: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            return CallExpression::fromSystemMethod(compilation, expr, selector, invocation,
                                                    withClause, context);
        }
        case SymbolKind::ErrorType:
            return badExpr(compilation, &expr);
        case SymbolKind::VoidType:
            if (auto sym = expr.getSymbolReference()) {
                if (sym->kind == SymbolKind::Coverpoint) {
                    scope = &sym->as<CoverpointSymbol>();
                    break;
                }
                else if (sym->kind == SymbolKind::CoverCross) {
                    scope = &sym->as<CoverCrossSymbol>();
                    break;
                }
            }
            [[fallthrough]];
        default: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }

    const Symbol* member = scope->find(selector.name);
    if (!member) {
        if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation, withClause,
                                               context)) {
            return *result;
        }

        auto& diag = context.addDiag(diag::UnknownMember, selector.nameRange.start());
        diag << expr.sourceRange;
        diag << selector.name;
        diag << *expr.type;
        return badExpr(compilation, &expr);
    }

    switch (member->kind) {
        case SymbolKind::Field: {
            auto& field = member->as<FieldSymbol>();
            return *compilation.emplace<MemberAccessExpression>(field.getType(), expr, field,
                                                                range);
        }
        case SymbolKind::ClassProperty: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& prop = member->as<ClassPropertySymbol>();
            if (prop.lifetime == VariableLifetime::Automatic &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return *compilation.emplace<MemberAccessExpression>(prop.getType(), expr, prop, range);
        }
        case SymbolKind::Subroutine: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& sub = member->as<SubroutineSymbol>();
            if (!sub.flags.has(MethodFlags::Static) &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return CallExpression::fromLookup(compilation, &sub, &expr, invocation, withClause,
                                              range, context);
        }
        case SymbolKind::ConstraintBlock:
        case SymbolKind::Coverpoint:
        case SymbolKind::CoverCross:
        case SymbolKind::CoverageBin: {
            if (errorIfNotProcedural())
                return badExpr(compilation, &expr);
            return *compilation.emplace<MemberAccessExpression>(compilation.getVoidType(), expr,
                                                                *member, range);
        }
        case SymbolKind::EnumValue:
            // The thing being selected from doesn't actually matter, since the
            // enum value is a constant.
            return ValueExpressionBase::fromSymbol(context, *member, nullptr, range);
        default: {
            if (member->isValue()) {
                auto& value = member->as<ValueSymbol>();
                return *compilation.emplace<MemberAccessExpression>(value.getType(), expr, value,
                                                                    range);
            }

            auto& diag = context.addDiag(diag::InvalidClassAccess, selector.dotLocation);
            diag << selector.nameRange;
            diag << expr.sourceRange;
            diag << selector.name;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }
}